

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseScript
          (WastParser *this,unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script
          )

{
  _Head_base<0UL,_wabt::Script_*,_false> __p;
  Result RVar1;
  TokenTypePair TVar2;
  long lVar3;
  Enum EVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  _Head_base<0UL,_wabt::Script_*,_false> local_38;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> script;
  
  MakeUnique<wabt::Script>();
  TVar2 = PeekPair(this);
  EVar4 = Error;
  if (((TVar2._M_elems[0] == Lpar) && (TVar2._M_elems[1] < First_Literal)) &&
     ((0x2c008dd800U >> ((ulong)TVar2._M_elems >> 0x20 & 0x3f) & 1) != 0)) {
    MakeUnique<wabt::ModuleCommand>();
    GetLocation((Location *)&local_90,this);
    local_50.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p =
         (pointer)local_90.field_2._M_allocated_capacity;
    local_50.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length = local_90.field_2._8_8_;
    ((local_50.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->field_2)._M_allocated_capacity =
         (size_type)local_90._M_dataplus._M_p;
    *(size_type *)
     ((long)&(local_50.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->field_2 + 8) = local_90._M_string_length;
    RVar1 = ParseModuleFieldList
                      (this,(Module *)
                            &(local_50.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_2);
    if (RVar1.enum_ != Error) {
      std::
      vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
      ::emplace_back<std::unique_ptr<wabt::ModuleCommand,std::default_delete<wabt::ModuleCommand>>>
                ((vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
                  *)local_38._M_head_impl,
                 (unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)
                 &local_50);
    }
    if (local_50.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(((local_50.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
    }
joined_r0x00da6726:
    if (RVar1.enum_ == Error) goto LAB_00da67e1;
  }
  else {
    TVar2 = PeekPair(this);
    if (((TVar2._M_elems[0] == Lpar) && (TVar2._M_elems[1] < Result)) &&
       ((0x411203fcU >> (TVar2._M_elems[1] & Result) & 1) != 0)) {
      RVar1 = ParseCommandList(this,local_38._M_head_impl,&(local_38._M_head_impl)->commands);
      goto joined_r0x00da6726;
    }
    ConsumeIfLpar(this);
    std::__cxx11::string::string
              ((string *)&local_90,"a module field",
               (allocator *)
               ((long)&script._M_t.
                       super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
                       super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl + 5));
    std::__cxx11::string::string
              (local_70,"a command",
               (allocator *)
               ((long)&script._M_t.
                       super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
                       super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl + 6));
    __l._M_len = 2;
    __l._M_array = &local_90;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_50,__l,
             (allocator_type *)
             ((long)&script._M_t.
                     super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
                     super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
                     super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl + 7));
    ErrorExpected(this,&local_50,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_50);
    lVar3 = 0x20;
    do {
      std::__cxx11::string::~string((string *)((long)&local_90._M_dataplus._M_p + lVar3));
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != -0x20);
  }
  RVar1 = Expect(this,Eof);
  __p._M_head_impl = local_38._M_head_impl;
  if ((RVar1.enum_ != Error) &&
     ((this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_start)) {
    local_38._M_head_impl = (Script *)0x0;
    std::__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>::reset
              ((__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_> *)out_script,
               __p._M_head_impl);
    EVar4 = Ok;
  }
LAB_00da67e1:
  std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::~unique_ptr
            ((unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)&local_38);
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseScript(std::unique_ptr<Script>* out_script) {
  WABT_TRACE(ParseScript);
  auto script = MakeUnique<Script>();

  // Don't consume the Lpar yet, even though it is required. This way the
  // sub-parser functions (e.g. ParseFuncModuleField) can consume it and keep
  // the parsing structure more regular.
  if (IsModuleField(PeekPair())) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    auto command = MakeUnique<ModuleCommand>();
    command->module.loc = GetLocation();
    CHECK_RESULT(ParseModuleFieldList(&command->module));
    script->commands.emplace_back(std::move(command));
  } else if (IsCommand(PeekPair())) {
    CHECK_RESULT(ParseCommandList(script.get(), &script->commands));
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a command"});
  }

  EXPECT(Eof);
  if (errors_->size() == 0) {
    *out_script = std::move(script);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}